

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void Am_Connection::Reset(void)

{
  fd_set *__arr;
  fd_set *pfVar1;
  
  connection_list = (Connection_List_Ptr)0x0;
  num_sockets = 0;
  max_socket = 0;
  m_parent_socket = 0;
  id_count = 0;
  pfVar1 = (fd_set *)operator_new(0x80);
  socket_flags = pfVar1;
  pfVar1->fds_bits[0] = 0;
  pfVar1->fds_bits[1] = 0;
  pfVar1->fds_bits[2] = 0;
  pfVar1->fds_bits[3] = 0;
  pfVar1->fds_bits[4] = 0;
  pfVar1->fds_bits[5] = 0;
  pfVar1->fds_bits[6] = 0;
  pfVar1->fds_bits[7] = 0;
  pfVar1->fds_bits[8] = 0;
  pfVar1->fds_bits[9] = 0;
  pfVar1->fds_bits[10] = 0;
  pfVar1->fds_bits[0xb] = 0;
  pfVar1->fds_bits[0xc] = 0;
  pfVar1->fds_bits[0xd] = 0;
  pfVar1->fds_bits[0xe] = 0;
  pfVar1->fds_bits[0xf] = 0;
  Register_Default_Methods();
  return;
}

Assistant:

void
Am_Connection::Reset(void)
{
  connection_list = nullptr;
  num_sockets = 0;
  max_socket = 0;
  m_parent_socket = 0;
  id_count = 0;
  socket_flags = new fd_set;
  FD_ZERO(socket_flags);
  Register_Default_Methods();
}